

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer pPVar1;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  other;
  SectionNode *pSVar2;
  SectionNode *this_00;
  undefined1 local_d8 [8];
  SectionStats incompleteStats;
  Ptr<Catch::CumulativeReporterBase::SectionNode> PStack_38;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  
  PStack_38.m_p = (SectionNode *)0x0;
  node.m_p = (SectionNode *)0x0;
  SectionStats::SectionStats
            ((SectionStats *)local_d8,sectionInfo,(Counts *)&stack0xffffffffffffffc8,0.0,false);
  PStack_38.m_p = (SectionNode *)0x0;
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar1) {
    if ((this->m_rootSection).m_p == (SectionNode *)0x0) {
      pSVar2 = (SectionNode *)operator_new(0x118);
      SectionNode::SectionNode(pSVar2,(SectionStats *)local_d8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_rootSection,pSVar2);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
              (&stack0xffffffffffffffc8,&this->m_rootSection);
  }
  else {
    pSVar2 = pPVar1[-1].m_p;
    incompleteStats._144_8_ = sectionInfo;
    other = std::
            find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::CumulativeReporterBase::BySectionInfo>
                      ((pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (BySectionInfo *)&incompleteStats.missingAssertions);
    if (other._M_current ==
        (pSVar2->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (SectionNode *)operator_new(0x118);
      SectionNode::SectionNode(this_00,(SectionStats *)local_d8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&stack0xffffffffffffffc8,this_00);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back(&pSVar2->childSections,&stack0xffffffffffffffc8);
    }
    else {
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
                (&stack0xffffffffffffffc8,other._M_current);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,&stack0xffffffffffffffc8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
            (&this->m_deepestSection,&stack0xffffffffffffffc8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::~Ptr(&stack0xffffffffffffffc8);
  SectionStats::~SectionStats((SectionStats *)local_d8);
  return;
}

Assistant:

virtual void sectionStarting(SectionInfo const& sectionInfo) CATCH_OVERRIDE {
			SectionStats incompleteStats(sectionInfo, Counts(), 0, false);
			Ptr<SectionNode> node;
			if (m_sectionStack.empty()) {
				if (!m_rootSection)
					m_rootSection = new SectionNode(incompleteStats);
				node = m_rootSection;
			}
			else {
				SectionNode& parentNode = *m_sectionStack.back();
				SectionNode::ChildSections::const_iterator it =
					std::find_if(parentNode.childSections.begin(),
						parentNode.childSections.end(),
						BySectionInfo(sectionInfo));
				if (it == parentNode.childSections.end()) {
					node = new SectionNode(incompleteStats);
					parentNode.childSections.push_back(node);
				}
				else
					node = *it;
			}
			m_sectionStack.push_back(node);
			m_deepestSection = node;
		}